

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::AggressiveDCEPass::AddDebugScopeToWorkList(AggressiveDCEPass *this,Instruction *inst)

{
  DebugScope DVar1;
  DefUseManager *pDVar2;
  Instruction *pIVar3;
  
  DVar1 = inst->dbg_scope_;
  if (DVar1.lexical_scope_ != 0) {
    pDVar2 = Pass::get_def_use_mgr((Pass *)this);
    pIVar3 = analysis::DefUseManager::GetDef(pDVar2,DVar1.lexical_scope_);
    AddToWorklist(this,pIVar3);
  }
  if ((ulong)DVar1 >> 0x20 == 0) {
    return;
  }
  pDVar2 = Pass::get_def_use_mgr((Pass *)this);
  pIVar3 = analysis::DefUseManager::GetDef(pDVar2,DVar1.inlined_at_);
  AddToWorklist(this,pIVar3);
  return;
}

Assistant:

void AggressiveDCEPass::AddDebugScopeToWorkList(const Instruction* inst) {
  auto scope = inst->GetDebugScope();
  auto lex_scope_id = scope.GetLexicalScope();
  if (lex_scope_id != kNoDebugScope)
    AddToWorklist(get_def_use_mgr()->GetDef(lex_scope_id));
  auto inlined_at_id = scope.GetInlinedAt();
  if (inlined_at_id != kNoInlinedAt)
    AddToWorklist(get_def_use_mgr()->GetDef(inlined_at_id));
}